

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

void __thiscall MinVR::VRDataIndex::VRDataIndex(VRDataIndex *this,VRDataIndex *orig)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  void *in_R8;
  undefined8 in_R9;
  _Self __tmp_1;
  _Self __tmp;
  _Rb_tree_node_base *p_Var4;
  undefined1 auVar5 [16];
  string *psVar6;
  VRDatumPtr local_40;
  
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_lastDatum)._M_node = (_Base_ptr)0x0;
  (this->_indexName)._M_dataplus._M_p = (pointer)&(this->_indexName).field_2;
  (this->_indexName)._M_string_length = 0;
  (this->_indexName).field_2._M_local_buf[0] = '\0';
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  psVar6 = &this->_indexName;
  p_Var2 = &(this->_linkRegister)._M_t._M_impl.super__Rb_tree_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)psVar6);
  this->_overwrite = orig->_overwrite;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
               *)this,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                       *)orig);
  auVar5._8_8_ = extraout_RDX;
  auVar5._0_8_ = (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var4 = auVar5._0_8_, (_Rb_tree_header *)p_Var4 != p_Var1) {
    VRDatumPtr::clone(&local_40,(__fn *)(p_Var4 + 2),auVar5._8_8_,(int)in_RCX,in_R8,in_R9,psVar6);
    VRDatumPtr::operator=((VRDatumPtr *)(p_Var4 + 2),&local_40);
    VRDatumPtr::~VRDatumPtr(&local_40);
    auVar5 = std::_Rb_tree_increment(p_Var4);
  }
  (this->_lastDatum)._M_node = &p_Var1->_M_header;
  for (p_Var3 = (orig->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(orig->_linkRegister)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    linkNode(this,(string *)(p_Var3 + 1),(string *)(p_Var3 + 2),0);
  }
  return;
}

Assistant:

VRDataIndex::VRDataIndex(const VRDataIndex& orig) {

  _indexName = orig._indexName;
  _overwrite = orig._overwrite;

  // Here's the shallow copy of the index.
  _theIndex = orig._theIndex;

  // Now we have to go through and do a deep copy of the data in the index.
  for (VRDataMap::iterator it = _theIndex.begin(); it != _theIndex.end(); it++) {
    it->second = it->second.clone();
  }

  // This part is not copied, but it's only a convenience, not part of the data.
  _lastDatum = _theIndex.end();

  // Then recreate the links.
  for (std::map<std::string, std::string>::const_iterator it = orig._linkRegister.begin();
       it != orig._linkRegister.end(); it++) {

    linkNode(it->first, it->second);
  }
}